

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing_deps.cc
# Opt level: O0

void __thiscall MissingDependencyScanner::PrintStats(MissingDependencyScanner *this)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  size_type sVar4;
  MissingDependencyScanner *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Processed ");
  sVar3 = std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::size(&this->seen_);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  std::operator<<(poVar2," nodes.\n");
  bVar1 = HadMissingDeps(this);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Error: There are ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->missing_dep_path_count_);
    std::operator<<(poVar2," missing dependency paths.\n");
    sVar3 = std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::size
                      (&this->nodes_missing_deps_);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,sVar3);
    poVar2 = std::operator<<(poVar2," targets had depfile dependencies on ");
    sVar3 = std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::size
                      (&this->generated_nodes_);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
    poVar2 = std::operator<<(poVar2," distinct generated inputs ");
    poVar2 = std::operator<<(poVar2,"(from ");
    sVar4 = std::set<const_Rule_*,_std::less<const_Rule_*>,_std::allocator<const_Rule_*>_>::size
                      (&this->generator_rules_);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar4);
    poVar2 = std::operator<<(poVar2," rules) ");
    std::operator<<(poVar2," without a non-depfile dep path to the generator.\n");
    std::operator<<((ostream *)&std::cout,
                    "There might be build flakiness if any of the targets listed above are built alone, or not late enough, in a clean output directory.\n"
                   );
  }
  else {
    std::operator<<((ostream *)&std::cout,"No missing dependencies on generated files found.\n");
  }
  return;
}

Assistant:

void MissingDependencyScanner::PrintStats() {
  std::cout << "Processed " << seen_.size() << " nodes.\n";
  if (HadMissingDeps()) {
    std::cout << "Error: There are " << missing_dep_path_count_
              << " missing dependency paths.\n";
    std::cout << nodes_missing_deps_.size()
              << " targets had depfile dependencies on "
              << generated_nodes_.size() << " distinct generated inputs "
              << "(from " << generator_rules_.size() << " rules) "
              << " without a non-depfile dep path to the generator.\n";
    std::cout << "There might be build flakiness if any of the targets listed "
                 "above are built alone, or not late enough, in a clean output "
                 "directory.\n";
  } else {
    std::cout << "No missing dependencies on generated files found.\n";
  }
}